

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_reporter.c
# Opt level: O1

void text_reporter_print_results
               (char *buf,char *prepend,int passes,int failures,int skips,int exceptions,
               uint32_t duration,_Bool use_colors)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  __sprintf_chk(buf,1,0xffffffffffffffff,"%s",prepend);
  if (((failures != 0 || passes != 0) || skips != 0) || exceptions != 0) {
    if (passes != 0) {
      pcVar3 = "\x1b[0m";
      if (!use_colors) {
        pcVar3 = "";
      }
      pcVar2 = "\x1b[32m";
      if (!use_colors) {
        pcVar2 = "";
      }
      if (passes < 1) {
        pcVar2 = "";
      }
      pcVar4 = "es";
      if (passes == 1) {
        pcVar4 = "";
      }
      __sprintf_chk(format_passes_buff,1,100,"%s%d %s%s%s",pcVar2,passes,"pass",pcVar4,pcVar3);
      strcat(buf,format_passes_buff);
    }
    if (skips != 0) {
      insert_comma(buf);
      pcVar3 = "\x1b[0m";
      if (!use_colors) {
        pcVar3 = "";
      }
      pcVar2 = "\x1b[33m";
      if (!use_colors) {
        pcVar2 = "";
      }
      if (skips < 1) {
        pcVar2 = "";
      }
      __sprintf_chk(format_skips_buff,1,100,"%s%d %s%s%s",pcVar2,skips,"skipped","",pcVar3);
      strcat(buf,format_skips_buff);
    }
    if (failures != 0) {
      insert_comma(buf);
      pcVar3 = "\x1b[0m";
      if (!use_colors) {
        pcVar3 = "";
      }
      pcVar2 = "\x1b[31m";
      if (!use_colors) {
        pcVar2 = "";
      }
      if (failures < 1) {
        pcVar2 = "";
      }
      pcVar4 = "s";
      if (failures == 1) {
        pcVar4 = "";
      }
      __sprintf_chk(format_failures_buff,1,100,"%s%d %s%s%s",pcVar2,failures,"failure",pcVar4,pcVar3
                   );
      strcat(buf,format_failures_buff);
    }
    if (exceptions != 0) {
      insert_comma(buf);
      pcVar3 = "\x1b[0m";
      if (!use_colors) {
        pcVar3 = "";
      }
      pcVar2 = "\x1b[35m";
      if (!use_colors) {
        pcVar2 = "";
      }
      if (exceptions < 1) {
        pcVar2 = "";
      }
      pcVar4 = "s";
      if (exceptions == 1) {
        pcVar4 = "";
      }
      __sprintf_chk(format_exceptions_buff,1,100,"%s%d %s%s%s",pcVar2,exceptions,"exception",pcVar4,
                    pcVar3);
      strcat(buf,format_exceptions_buff);
    }
    __snprintf_chk(format_duration_buff,100,1,100," in %dms",duration);
    strcat(buf,format_duration_buff);
    return;
  }
  sVar1 = strlen(buf);
  builtin_strncpy(buf + sVar1,"No assertions",0xe);
  return;
}

Assistant:

static void text_reporter_print_results(char *buf, char *prepend,
    int passes, int failures, int skips, int exceptions, uint32_t duration,
    bool use_colors) {

    sprintf(buf, "%s", prepend);
    if (passes || failures || skips || exceptions) {
        if (passes)
            strcat(buf, format_passes(passes, use_colors));
        if (skips) {
            insert_comma(buf);
            strcat(buf, format_skips(skips, use_colors));
        }
        if (failures) {
            insert_comma(buf);
            strcat(buf, format_failures(failures, use_colors));
        }
        if (exceptions) {
            insert_comma(buf);
            strcat(buf, format_exceptions(exceptions, use_colors));
        }
        strcat(buf, format_duration(duration));
    } else {
        strcat(buf, "No assertions");
    }
}